

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O1

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks)

{
  curl_socket_t __fd;
  int iVar1;
  curl_socklen_t addrlen;
  anon_union_16_2_022c54a6 a;
  int reuse;
  anon_union_16_2_022c54a6 a2;
  pollfd pfd [1];
  socklen_t local_4c;
  sockaddr local_48;
  undefined4 local_34;
  sockaddr local_30;
  pollfd local_20;
  
  local_4c = 0x10;
  local_34 = 1;
  __fd = socket(2,1,6);
  if (__fd == -1) {
    return -1;
  }
  local_48.sa_data[6] = '\0';
  local_48.sa_data[7] = '\0';
  local_48.sa_data[8] = '\0';
  local_48.sa_data[9] = '\0';
  local_48.sa_data[10] = '\0';
  local_48.sa_data[0xb] = '\0';
  local_48.sa_data[0xc] = '\0';
  local_48.sa_data[0xd] = '\0';
  local_48.sa_family = 2;
  local_48.sa_data[0] = '\0';
  local_48.sa_data[1] = '\0';
  local_48.sa_data[2] = '\x7f';
  local_48.sa_data[3] = '\0';
  local_48.sa_data[4] = '\0';
  local_48.sa_data[5] = '\x01';
  socks[0] = -1;
  socks[1] = -1;
  iVar1 = setsockopt(__fd,1,2,&local_34,4);
  if ((((iVar1 != -1) && (iVar1 = bind(__fd,&local_48,0x10), iVar1 != -1)) &&
      (iVar1 = getsockname(__fd,&local_48,&local_4c), iVar1 != -1)) &&
     ((0xf < local_4c && (iVar1 = listen(__fd,1), iVar1 != -1)))) {
    iVar1 = socket(2,1,0);
    *socks = iVar1;
    if ((iVar1 != -1) &&
       ((iVar1 = connect(iVar1,&local_48,0x10), iVar1 != -1 &&
        (iVar1 = curlx_nonblock(__fd,1), -1 < iVar1)))) {
      local_20.events = 1;
      local_20.revents = 0;
      local_20.fd = __fd;
      Curl_poll(&local_20,1,10000);
      iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
      socks[1] = iVar1;
      if (iVar1 != -1) {
        local_4c = 0x10;
        iVar1 = getsockname(*socks,&local_48,&local_4c);
        if ((iVar1 != -1) && (0xf < local_4c)) {
          local_4c = 0x10;
          iVar1 = getpeername(socks[1],&local_30,&local_4c);
          if ((iVar1 != -1) &&
             (((0xf < local_4c && (local_48.sa_family == local_30.sa_family)) &&
              (local_48.sa_data._2_4_ == local_30.sa_data._2_4_)))) {
            iVar1 = 0;
            if (local_48.sa_data._0_2_ == local_30.sa_data._0_2_) goto LAB_0014177a;
          }
        }
      }
    }
  }
  close(__fd);
  close(*socks);
  __fd = socks[1];
  iVar1 = -1;
LAB_0014177a:
  close(__fd);
  return iVar1;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2])
{
  union {
    struct sockaddr_in inaddr;
    struct sockaddr addr;
  } a, a2;
  curl_socket_t listener;
  curl_socklen_t addrlen = sizeof(a.inaddr);
  int reuse = 1;
  struct pollfd pfd[1];
  (void)domain;
  (void)type;
  (void)protocol;

  listener = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  if(listener == CURL_SOCKET_BAD)
    return -1;

  memset(&a, 0, sizeof(a));
  a.inaddr.sin_family = AF_INET;
  a.inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  a.inaddr.sin_port = 0;

  socks[0] = socks[1] = CURL_SOCKET_BAD;

  if(setsockopt(listener, SOL_SOCKET, SO_REUSEADDR,
                (char *)&reuse, (curl_socklen_t)sizeof(reuse)) == -1)
    goto error;
  if(bind(listener, &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  if(getsockname(listener, &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  if(listen(listener, 1) == -1)
    goto error;
  socks[0] = socket(AF_INET, SOCK_STREAM, 0);
  if(socks[0] == CURL_SOCKET_BAD)
    goto error;
  if(connect(socks[0], &a.addr, sizeof(a.inaddr)) == -1)
    goto error;

  /* use non-blocking accept to make sure we don't block forever */
  if(curlx_nonblock(listener, TRUE) < 0)
    goto error;
  pfd[0].fd = listener;
  pfd[0].events = POLLIN;
  pfd[0].revents = 0;
  (void)Curl_poll(pfd, 1, 10*1000); /* 10 seconds */
  socks[1] = accept(listener, NULL, NULL);
  if(socks[1] == CURL_SOCKET_BAD)
    goto error;

  /* verify that nothing else connected */
  addrlen = sizeof(a.inaddr);
  if(getsockname(socks[0], &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  addrlen = sizeof(a2.inaddr);
  if(getpeername(socks[1], &a2.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a2.inaddr))
    goto error;
  if(a.inaddr.sin_family != a2.inaddr.sin_family ||
     a.inaddr.sin_addr.s_addr != a2.inaddr.sin_addr.s_addr ||
     a.inaddr.sin_port != a2.inaddr.sin_port)
    goto error;

  sclose(listener);
  return 0;

  error:
  sclose(listener);
  sclose(socks[0]);
  sclose(socks[1]);
  return -1;
}